

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O2

void build_terminal_node_mappings<ExtIsoForest>(TreesIndexer *indexer,ExtIsoForest *model)

{
  pointer puVar1;
  pointer pSVar2;
  iterator __begin2;
  pointer pSVar3;
  size_t tree;
  ulong uVar4;
  pointer pSVar5;
  long lVar6;
  long lVar7;
  
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
            (&indexer->indices,
             ((long)(model->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::_M_shrink_to_fit
            (&indexer->indices);
  pSVar5 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar5 != pSVar2) &&
     (pSVar3 = pSVar5,
     (pSVar5->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_start !=
     (pSVar5->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    for (; pSVar3 != pSVar2; pSVar3 = pSVar3 + 1) {
      puVar1 = (pSVar3->reference_points).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar3->reference_points).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar1) {
        (pSVar3->reference_points).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar1;
      }
      puVar1 = (pSVar3->reference_indptr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar3->reference_indptr).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar1) {
        (pSVar3->reference_indptr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar1;
      }
      puVar1 = (pSVar3->reference_mapping).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((pSVar3->reference_mapping).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar1) {
        (pSVar3->reference_mapping).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar1;
      }
    }
  }
  lVar7 = 0x90;
  lVar6 = 0;
  for (uVar4 = 0; uVar4 < (ulong)(((long)pSVar2 - (long)pSVar5) / 0x98); uVar4 = uVar4 + 1) {
    build_terminal_node_mappings_single_tree<IsoHPlane>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)pSVar5 + lVar7 + -0x90),
               (size_t *)
               ((long)&(pSVar5->terminal_node_mappings).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar7),
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
               ((long)&(((model->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl + lVar6));
    pSVar5 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar2 = (indexer->indices).
             super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar6 = lVar6 + 0x18;
    lVar7 = lVar7 + 0x98;
  }
  return;
}

Assistant:

void build_terminal_node_mappings(TreesIndexer &indexer, const Model &model)
{
    indexer.indices.resize(get_ntrees(model));
    indexer.indices.shrink_to_fit();

    if (!indexer.indices.empty() && !indexer.indices.front().reference_points.empty())
    {
        for (auto &ind : indexer.indices)
        {
            ind.reference_points.clear();
            ind.reference_indptr.clear();
            ind.reference_mapping.clear();
        }
    }

    for (size_t tree = 0; tree < indexer.indices.size(); tree++)
    {
        build_terminal_node_mappings_single_tree(indexer.indices[tree].terminal_node_mappings,
                                                 indexer.indices[tree].n_terminal,
                                                 get_tree(model, tree));
    }
}